

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<long,double>(Thread *this,Ptr *out_trap)

{
  double dVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  dVar1 = (double)VVar2.field_0.f64_;
  if (NAN(dVar1)) {
    DoConvert<long,double>();
  }
  else {
    if ((-9.223372036854776e+18 <= dVar1) && (dVar1 < 9.223372036854776e+18)) {
      VVar2.field_0._0_8_ = (ulong)dVar1;
      VVar2.field_0._8_8_ = 0;
      Push(this,VVar2);
      return Ok;
    }
    DoConvert<long,double>();
  }
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}